

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extreme_value_dist.hpp
# Opt level: O2

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,param_type *P)

{
  undefined4 uVar1;
  basic_istream<char,_std::char_traits<char>_> *pbVar2;
  istream *piVar3;
  long lVar4;
  delim_c local_3b;
  delim_c local_3a;
  delim_c local_39;
  unkbyte10 local_38;
  unkbyte10 local_28;
  
  uVar1 = *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = 0x26;
  local_39.c = '(';
  pbVar2 = utility::operator>>(in,&local_39);
  piVar3 = std::istream::_M_extract<long_double>((longdouble *)pbVar2);
  local_3a.c = ' ';
  pbVar2 = utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)piVar3,&local_3a);
  piVar3 = std::istream::_M_extract<long_double>((longdouble *)pbVar2);
  local_3b.c = ')';
  utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)piVar3,&local_3b);
  lVar4 = *(long *)(*(long *)in + -0x18);
  if (((byte)in[lVar4 + 0x20] & 5) == 0) {
    *(unkbyte10 *)&P->theta_ = local_28;
    *(unkbyte10 *)&P->eta_ = local_38;
    lVar4 = *(long *)(*(long *)in + -0x18);
  }
  *(undefined4 *)(in + lVar4 + 0x18) = uVar1;
  return in;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
          std::basic_istream<char_t, traits_t> &in, param_type &P) {
        float_t theta, eta;
        std::ios_base::fmtflags flags(in.flags());
        in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        in >> utility::delim('(') >> theta >> utility::delim(' ') >> eta >> utility::delim(')');
        if (in)
          P = param_type(theta, eta);
        in.flags(flags);
        return in;
      }